

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

void tcg_gen_abs_vec_sparc64(TCGContext_conflict8 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a)

{
  TCGv_vec a0;
  TCGv_vec pTVar1;
  TCGv_vec_d TVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  TCGOp *pTVar6;
  TCGv_vec r_00;
  uintptr_t o_1;
  TCGTemp *rt;
  uintptr_t o;
  TCGType TVar7;
  uintptr_t o_2;
  
  a0 = r + (long)&tcg_ctx->pool_cur;
  pTVar1 = a + (long)&tcg_ctx->pool_cur;
  uVar4 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  TVar7 = uVar4 >> 0x10 & 0xff;
  iVar5 = tcg_can_emit_vec_op_sparc64(tcg_ctx,INDEX_op_abs_vec,TVar7,vece);
  if (0 < iVar5) {
    pTVar6 = tcg_emit_op_sparc64(tcg_ctx,INDEX_op_abs_vec);
    pTVar6->field_0x1 =
         (byte)((vece << 0xc) >> 8) | (byte)((uVar4 >> 0x10) * 0x100 + 0xe00 >> 8) & 0xf;
    pTVar6->args[0] = (TCGArg)a0;
    pTVar6->args[1] = (TCGArg)pTVar1;
    return;
  }
  if (-1 < iVar5) {
    TVar2 = a0[2];
    TVar7 = (TCGType)(byte)TVar2;
    r_00 = tcg_temp_new_vec_sparc64(tcg_ctx,TVar7);
    tcg_can_emit_vec_op_sparc64(tcg_ctx,INDEX_op_sub_vec,(uint)(byte)TVar2,vece);
    iVar5 = tcg_can_emit_vec_op_sparc64(tcg_ctx,INDEX_op_smax_vec,TVar7,vece);
    if (iVar5 < 1) {
      iVar5 = tcg_can_emit_vec_op_sparc64(tcg_ctx,INDEX_op_sari_vec,TVar7,vece);
      if (iVar5 < 1) {
        uVar4 = *(uint *)(r_00 + (long)&tcg_ctx->pool_cur);
        pTVar6 = tcg_emit_op_sparc64(tcg_ctx,INDEX_op_dupi_vec);
        *(uint *)pTVar6 = (*(uint *)pTVar6 & 0xffff00ff) + ((uVar4 >> 8) + 0xe00 & 0xf00) + 0x3000;
        pTVar6->args[0] = (TCGArg)(r_00 + (long)&tcg_ctx->pool_cur);
        pTVar6->args[1] = 0;
        tcg_gen_cmp_vec_sparc64(tcg_ctx,TCG_COND_LT,vece,r_00,a,r_00);
      }
      else {
        do_shifti(tcg_ctx,INDEX_op_sari_vec,vece,r_00,a,(long)((8 << ((byte)vece & 0x1f)) + -1));
      }
      uVar3 = *(ushort *)(a0 + 2);
      pTVar6 = tcg_emit_op_sparc64(tcg_ctx,INDEX_op_xor_vec);
      pTVar6->field_0x1 = (byte)((uint)uVar3 * 0x100 + 0xe00 >> 8) & 0xf;
      pTVar6->args[0] = (TCGArg)a0;
      pTVar6->args[1] = (TCGArg)pTVar1;
      pTVar6->args[2] = (TCGArg)(r_00 + (long)&tcg_ctx->pool_cur);
      do_op3(tcg_ctx,vece,r,r,r_00,INDEX_op_sub_vec);
    }
    else {
      tcg_gen_neg_vec_sparc64(tcg_ctx,vece,r_00,a);
      do_minmax(tcg_ctx,vece,r,a,r_00,INDEX_op_smax_vec,TCG_COND_GT);
    }
    tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(r_00 + (long)tcg_ctx));
    return;
  }
  tcg_expand_vec_op_sparc64(tcg_ctx,INDEX_op_abs_vec,TVar7,vece,(TCGArg)a0,pTVar1);
  return;
}

Assistant:

void tcg_gen_abs_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a)
{
    const TCGOpcode *hold_list;

    tcg_assert_listed_vecop(INDEX_op_abs_vec);
    hold_list = tcg_swap_vecop_list(NULL);

    if (!do_op2(tcg_ctx, vece, r, a, INDEX_op_abs_vec)) {
        TCGType type = tcgv_vec_temp(tcg_ctx, r)->base_type;
        TCGv_vec t = tcg_temp_new_vec(tcg_ctx, type);

        tcg_debug_assert(tcg_can_emit_vec_op(tcg_ctx, INDEX_op_sub_vec, type, vece));
        if (tcg_can_emit_vec_op(tcg_ctx, INDEX_op_smax_vec, type, vece) > 0) {
            tcg_gen_neg_vec(tcg_ctx, vece, t, a);
            tcg_gen_smax_vec(tcg_ctx, vece, r, a, t);
        } else {
            if (tcg_can_emit_vec_op(tcg_ctx, INDEX_op_sari_vec, type, vece) > 0) {
                tcg_gen_sari_vec(tcg_ctx, vece, t, a, (8 << vece) - 1);
            } else {
                do_dupi_vec(tcg_ctx, t, MO_REG, 0);
                tcg_gen_cmp_vec(tcg_ctx, TCG_COND_LT, vece, t, a, t);
            }
            tcg_gen_xor_vec(tcg_ctx, vece, r, a, t);
            tcg_gen_sub_vec(tcg_ctx, vece, r, r, t);
        }

        tcg_temp_free_vec(tcg_ctx, t);
    }
    tcg_swap_vecop_list(hold_list);
}